

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key.cpp
# Opt level: O1

ssize_t __thiscall
cppurses::Key::Press::send(Press *this,int __fd,void *__buf,size_t __n,int __flags)

{
  bool bVar1;
  uint uVar2;
  ulong unaff_RBP;
  
  if (*(short *)&(this->super_Event).super_Input_event.field_0x1c == 9) {
    unaff_RBP = CONCAT71((int7)(unaff_RBP >> 8),1);
    bVar1 = Focus::tab_press();
    if (bVar1) goto LAB_001500ee;
  }
  if (*(short *)&(this->super_Event).super_Input_event.field_0x1c == 0x161) {
    unaff_RBP = CONCAT71((int7)(unaff_RBP >> 8),1);
    bVar1 = Focus::shift_tab_press();
    if (bVar1) goto LAB_001500ee;
  }
  uVar2 = (*((this->super_Event).super_Input_event.super_Event.receiver_)->_vptr_Widget[0x10])();
  unaff_RBP = (ulong)uVar2;
LAB_001500ee:
  return unaff_RBP & 0xffffffff;
}

Assistant:

bool Key::Press::send() const {
    if (key_ == Code::Tab && Focus::tab_press()) {
        return true;
    }
    if (key_ == Code::Back_tab && Focus::shift_tab_press()) {
        return true;
    }
    return receiver_.key_press_event(Key::State{key_, key_to_char(key_)});
}